

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
jsonnet::internal::LiteralString::LiteralString
          (LiteralString *this,LocationRange *lr,Fodder *open_fodder,UString *value,
          TokenKind token_kind,string *block_indent,string *block_term_indent)

{
  AST::AST(&this->super_AST,lr,AST_LITERAL_STRING,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralString_00231f58;
  std::__cxx11::u32string::u32string((u32string *)&this->value,value);
  this->tokenKind = token_kind;
  std::__cxx11::string::string((string *)&this->blockIndent,(string *)block_indent);
  std::__cxx11::string::string((string *)&this->blockTermIndent,(string *)block_term_indent);
  return;
}

Assistant:

LiteralString(const LocationRange &lr, const Fodder &open_fodder, const UString &value,
                  TokenKind token_kind, const std::string &block_indent,
                  const std::string &block_term_indent)
        : AST(lr, AST_LITERAL_STRING, open_fodder),
          value(value),
          tokenKind(token_kind),
          blockIndent(block_indent),
          blockTermIndent(block_term_indent)
    {
    }